

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cc
# Opt level: O0

void tcmalloc::DLL_Prepend(Span *list,Span *span)

{
  Span *span_local;
  Span *list_local;
  
  span->next = list->next;
  span->prev = list;
  list->next->prev = span;
  list->next = span;
  return;
}

Assistant:

void DLL_Prepend(Span* list, Span* span) {
  ASSERT(span->next == nullptr);
  ASSERT(span->prev == nullptr);
  span->next = list->next;
  span->prev = list;
  list->next->prev = span;
  list->next = span;
}